

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O1

void __thiscall Alice::BlindPermuteData(Alice *this)

{
  pointer pvVar1;
  pointer pvVar2;
  long lVar3;
  long lVar4;
  Server *this_00;
  long lVar5;
  undefined1 auVar6 [8];
  long lVar7;
  int j;
  long lVar8;
  vector<DataElement,_std::allocator<DataElement>_> local_60;
  vector<DataElement,_std::allocator<DataElement>_> local_48;
  undefined1 local_30 [8];
  vector<DataElement,_std::allocator<DataElement>_> V;
  
  std::vector<DataElement,_std::allocator<DataElement>_>::vector
            ((vector<DataElement,_std::allocator<DataElement>_> *)local_30,
             (long)(this->super_Party).n_d,(allocator_type *)&local_48);
  lVar5 = (long)(this->super_Party).n_d;
  if (0 < lVar5) {
    pvVar1 = (this->super_Party).D.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar2 = (this->super_Party).R_D.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar7 = 0;
    auVar6 = local_30;
    do {
      lVar3 = *(long *)&pvVar1[lVar7].super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data;
      lVar4 = *(long *)&pvVar2[lVar7].super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data;
      lVar8 = 0;
      do {
        ((pointer)auVar6)->val[lVar8] = *(long *)(lVar4 + lVar8 * 8) + *(long *)(lVar3 + lVar8 * 8);
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
      lVar7 = lVar7 + 1;
      auVar6 = (undefined1  [8])((long)auVar6 + 0x10);
    } while (lVar7 != lVar5);
  }
  this_00 = this->srv;
  std::vector<DataElement,_std::allocator<DataElement>_>::vector
            (&local_60,(vector<DataElement,_std::allocator<DataElement>_> *)local_30);
  Server::SendDataVector(this_00,&local_60,(this->super_Party).n_d);
  if (local_60.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<DataElement,_std::allocator<DataElement>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<DataElement,_std::allocator<DataElement>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  Server::ReceiveDataVector(&local_48,this->srv);
  std::vector<DataElement,_std::allocator<DataElement>_>::operator=
            ((vector<DataElement,_std::allocator<DataElement>_> *)local_30,&local_48);
  if (local_48.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<DataElement,_std::allocator<DataElement>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<DataElement,_std::allocator<DataElement>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  lVar5 = (long)(this->super_Party).n_d;
  if (0 < lVar5) {
    pvVar1 = (this->super_Party).D.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar2 = (this->Pi_D_diff_R_DB_R_DA).
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar7 = 0;
    auVar6 = local_30;
    do {
      lVar3 = *(long *)&pvVar2[lVar7].super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data;
      lVar4 = *(long *)&pvVar1[lVar7].super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data;
      lVar8 = 0;
      do {
        *(long *)(lVar4 + lVar8 * 8) = *(long *)(lVar3 + lVar8 * 8) + ((pointer)auVar6)->val[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
      lVar7 = lVar7 + 1;
      auVar6 = (undefined1  [8])((long)auVar6 + 0x10);
    } while (lVar7 != lVar5);
  }
  if (local_30 != (undefined1  [8])0x0) {
    operator_delete((void *)local_30,
                    (long)V.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)local_30);
  }
  return;
}

Assistant:

void Alice::BlindPermuteData()
{
    std::vector<DataElement> V(n_d);
    for(int i=0; i<n_d; i++)
        for(int j=0; j<2; j++)
            V[i].val[j] = D[i][j] + R_D[i][j]; //masking Alice's data share
    srv->SendDataVector(V, n_d);    //sending Alice's masked data share to Bob for BlindPermutation
    V = srv->ReceiveDataVector();   //receiving Alice's BlindPermuted share of D
    for(int i=0; i<n_d; i++)
        for(int j=0; j<2; j++)
            D[i][j] = V[i].val[j] + Pi_D_diff_R_DB_R_DA[i][j]; //Adjusting for the resplit
}